

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbtz.cpp
# Opt level: O2

int32_t __thiscall
icu_63::RuleBasedTimeZone::getLocalDelta
          (RuleBasedTimeZone *this,int32_t rawBefore,int32_t dstBefore,int32_t rawAfter,
          int32_t dstAfter,int32_t NonExistingTimeOpt,int32_t DuplicatedTimeOpt)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  
  iVar2 = rawBefore + dstBefore;
  iVar3 = rawAfter + dstAfter;
  bVar5 = dstAfter == 0;
  bVar6 = dstBefore == 0;
  bVar1 = !bVar6 && bVar5;
  bVar7 = bVar6 && !bVar5;
  if (iVar3 < iVar2) {
    uVar4 = DuplicatedTimeOpt & 3;
    if ((bVar1 && uVar4 == 1) || (bVar7 && uVar4 == 3)) {
      return iVar3;
    }
    if (bVar1 && uVar4 == 3 || bVar7 && uVar4 == 1) {
      return iVar2;
    }
    bVar7 = (DuplicatedTimeOpt & 0xcU) == 4;
  }
  else {
    uVar4 = NonExistingTimeOpt & 3;
    if (bVar1 && uVar4 == 1) {
      return iVar2;
    }
    if (bVar7 && uVar4 == 3) {
      return iVar2;
    }
    if ((!bVar6 && bVar5) && uVar4 == 3 || (bVar6 && !bVar5) && uVar4 == 1) {
      return iVar3;
    }
    bVar7 = (~NonExistingTimeOpt & 0xcU) == 0;
  }
  if (!bVar7) {
    iVar2 = iVar3;
  }
  return iVar2;
}

Assistant:

int32_t
RuleBasedTimeZone::getLocalDelta(int32_t rawBefore, int32_t dstBefore, int32_t rawAfter, int32_t dstAfter,
                             int32_t NonExistingTimeOpt, int32_t DuplicatedTimeOpt) const {
    int32_t delta = 0;

    int32_t offsetBefore = rawBefore + dstBefore;
    int32_t offsetAfter = rawAfter + dstAfter;

    UBool dstToStd = (dstBefore != 0) && (dstAfter == 0);
    UBool stdToDst = (dstBefore == 0) && (dstAfter != 0);

    if (offsetAfter - offsetBefore >= 0) {
        // Positive transition, which makes a non-existing local time range
        if (((NonExistingTimeOpt & kStdDstMask) == kStandard && dstToStd)
                || ((NonExistingTimeOpt & kStdDstMask) == kDaylight && stdToDst)) {
            delta = offsetBefore;
        } else if (((NonExistingTimeOpt & kStdDstMask) == kStandard && stdToDst)
                || ((NonExistingTimeOpt & kStdDstMask) == kDaylight && dstToStd)) {
            delta = offsetAfter;
        } else if ((NonExistingTimeOpt & kFormerLatterMask) == kLatter) {
            delta = offsetBefore;
        } else {
            // Interprets the time with rule before the transition,
            // default for non-existing time range
            delta = offsetAfter;
        }
    } else {
        // Negative transition, which makes a duplicated local time range
        if (((DuplicatedTimeOpt & kStdDstMask) == kStandard && dstToStd)
                || ((DuplicatedTimeOpt & kStdDstMask) == kDaylight && stdToDst)) {
            delta = offsetAfter;
        } else if (((DuplicatedTimeOpt & kStdDstMask) == kStandard && stdToDst)
                || ((DuplicatedTimeOpt & kStdDstMask) == kDaylight && dstToStd)) {
            delta = offsetBefore;
        } else if ((DuplicatedTimeOpt & kFormerLatterMask) == kFormer) {
            delta = offsetBefore;
        } else {
            // Interprets the time with rule after the transition,
            // default for duplicated local time range
            delta = offsetAfter;
        }
    }
    return delta;
}